

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxvecs.hpp
# Opt level: O3

void __thiscall soplex::SPxSolverBase<double>::computeFrhs(SPxSolverBase<double> *this)

{
  double dVar1;
  Representation RVar2;
  Status SVar3;
  int iVar4;
  pointer pdVar5;
  pointer pdVar6;
  Status *pSVar7;
  VectorBase<double> *pVVar8;
  SVSetBase<double> *pSVar9;
  Item *pIVar10;
  vector<double,_std::allocator<double>_> *__range2;
  long lVar11;
  undefined8 *puVar12;
  uint uVar13;
  ulong uVar14;
  long lVar15;
  VectorBase<double> *pVVar16;
  long lVar17;
  int *piVar18;
  undefined1 *local_40;
  long local_38;
  undefined1 local_30 [16];
  
  if (this->theRep == COLUMN) {
    pdVar5 = (this->theFrhs->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->theFrhs->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pdVar5 != pdVar6) {
      memset(pdVar5,0,(long)pdVar6 - (long)pdVar5 & 0xfffffffffffffff8);
    }
    if (this->theType != LEAVE) {
      (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
        super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x7b])
                (this,this->theUbound,this->theLbound);
      computeFrhs2(this,this->theCoUbound,this->theCoLbound);
      return;
    }
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x7a])(this);
    lVar11 = (long)(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                   super_SVSetBase<double>.set.thenum;
    if (0 < lVar11) {
      pSVar7 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
      RVar2 = this->theRep;
      pVVar8 = this->theFrhs;
      lVar15 = 0;
      do {
        SVar3 = pSVar7[lVar15];
        if (RVar2 * SVar3 < 1) {
          pVVar16 = &(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.right;
          switch(SVar3) {
          default:
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"ESVECS01 ERROR: ",0x10);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"inconsistent basis must not happen!",0x23);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
            puVar12 = (undefined8 *)__cxa_allocate_exception(0x28);
            local_40 = local_30;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_40,"XSVECS01 This should never happen.","");
            *puVar12 = &PTR__SPxException_003adbd8;
            puVar12[1] = puVar12 + 3;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)(puVar12 + 1),local_40,local_40 + local_38);
            *puVar12 = &PTR__SPxException_003ae9a0;
            __cxa_throw(puVar12,&SPxInternalCodeException::typeinfo,SPxException::~SPxException);
          case P_ON_LOWER:
            pVVar16 = &(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.left;
          case P_FIXED:
          case P_ON_UPPER:
            pdVar5 = (pVVar8->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar5[lVar15] =
                 (pVVar16->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar15] + pdVar5[lVar15];
            break;
          case P_FREE:
            break;
          }
        }
        lVar15 = lVar15 + 1;
      } while (lVar11 != lVar15);
    }
  }
  else if (this->theType == ENTER) {
    pdVar5 = (this->theFrhs->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar6 = (this->theFrhs->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pdVar5 != pdVar6) {
      memset(pdVar5,0,(long)pdVar6 - (long)pdVar5 & 0xfffffffffffffff8);
    }
    (*(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.super_SVSetBase<double>.
      super_ClassArray<soplex::Nonzero<double>_>._vptr_ClassArray[0x7b])
              (this,this->theUbound,this->theLbound);
    computeFrhs2(this,this->theCoUbound,this->theCoLbound);
    pdVar5 = (this->theFrhs->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar13 = (uint)((ulong)((long)(this->theFrhs->val).
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data._M_finish - (long)pdVar5) >> 3);
    if (0 < (int)uVar13) {
      pdVar6 = (this->super_SPxLPBase<double>).super_LPColSetBase<double>.object.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      uVar14 = 0;
      do {
        pdVar5[uVar14] = pdVar6[uVar14] + pdVar5[uVar14];
        uVar14 = uVar14 + 1;
      } while ((uVar13 & 0x7fffffff) != uVar14);
    }
  }
  else {
    VectorBase<double>::operator=
              (this->theFrhs,&(this->super_SPxLPBase<double>).super_LPColSetBase<double>.object);
    lVar11 = (long)(this->super_SPxLPBase<double>).super_LPRowSetBase<double>.
                   super_SVSetBase<double>.set.thenum;
    if (0 < lVar11) {
      pSVar7 = (this->super_SPxBasisBase<double>).thedesc.rowstat.data;
      RVar2 = this->theRep;
      pdVar5 = (this->super_SPxLPBase<double>).super_LPRowSetBase<double>.object.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      pSVar9 = this->thevectors;
      pVVar8 = this->theFrhs;
      lVar15 = 0;
      do {
        SVar3 = pSVar7[lVar15];
        if (((RVar2 * SVar3 < 1) && ((uint)SVar3 < 7)) && ((0x54U >> (SVar3 & 0x1f) & 1) != 0)) {
          dVar1 = pdVar5[lVar15];
          if ((dVar1 != 0.0) || (NAN(dVar1))) {
            pIVar10 = (pSVar9->set).theitem;
            iVar4 = (pSVar9->set).thekey[lVar15].idx;
            lVar17 = (long)pIVar10[iVar4].data.super_SVectorBase<double>.memused;
            if (0 < lVar17) {
              pdVar6 = (pVVar8->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              uVar14 = lVar17 + 1;
              piVar18 = &pIVar10[iVar4].data.super_SVectorBase<double>.m_elem[lVar17 + -1].idx;
              do {
                pdVar6[*piVar18] =
                     ((Nonzero<double> *)(piVar18 + -2))->val * dVar1 + pdVar6[*piVar18];
                uVar14 = uVar14 - 1;
                piVar18 = piVar18 + -4;
              } while (1 < uVar14);
            }
          }
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != lVar11);
    }
  }
  return;
}

Assistant:

void SPxSolverBase<R>::computeFrhs()
{

   if(rep() == COLUMN)
   {
      theFrhs->clear();

      if(type() == LEAVE)
      {
         computeFrhsXtra();

         for(int i = 0; i < this->nRows(); i++)
         {
            R x;

            typename SPxBasisBase<R>::Desc::Status stat = this->desc().rowStatus(i);

            if(!isBasic(stat))
            {
               // coverity[switch_selector_expr_is_constant]
               switch(stat)
               {
               // columnwise cases:
               case SPxBasisBase<R>::Desc::P_FREE :
                  continue;

               case(SPxBasisBase<R>::Desc::P_FIXED) :
                  assert(EQ(this->lhs(i), this->rhs(i), this->epsilon()));

               //lint -fallthrough
               case SPxBasisBase<R>::Desc::P_ON_UPPER :
                  x = this->rhs(i);
                  break;

               case SPxBasisBase<R>::Desc::P_ON_LOWER :
                  x = this->lhs(i);
                  break;

               default:
                  SPX_MSG_ERROR(std::cerr << "ESVECS01 ERROR: "
                                << "inconsistent basis must not happen!"
                                << std::endl;)
                  throw SPxInternalCodeException("XSVECS01 This should never happen.");
               }

               assert(x < R(infinity));
               assert(x > R(-infinity));
               (*theFrhs)[i] += x;     // slack !
            }
         }
      }
      else
      {
         computeFrhs1(*theUbound, *theLbound);
         computeFrhs2(*theCoUbound, *theCoLbound);
      }
   }
   else
   {
      assert(rep() == ROW);

      if(type() == ENTER)
      {
         theFrhs->clear();
         computeFrhs1(*theUbound, *theLbound);
         computeFrhs2(*theCoUbound, *theCoLbound);
         *theFrhs += this->maxObj();
      }
      else
      {
         ///@todo put this into a separate method
         *theFrhs = this->maxObj();
         const typename SPxBasisBase<R>::Desc& ds = this->desc();

         for(int i = 0; i < this->nRows(); ++i)
         {
            typename SPxBasisBase<R>::Desc::Status stat = ds.rowStatus(i);

            if(!isBasic(stat))
            {
               R x;

               // coverity[switch_selector_expr_is_constant]
               switch(stat)
               {
               case SPxBasisBase<R>::Desc::D_FREE :
                  continue;

               case SPxBasisBase<R>::Desc::D_ON_UPPER :
               case SPxBasisBase<R>::Desc::D_ON_LOWER :
               case(SPxBasisBase<R>::Desc::D_ON_BOTH) :
                  x = this->maxRowObj(i);
                  break;

               default:
                  assert(this->lhs(i) <= R(-infinity) && this->rhs(i) >= R(infinity));
                  x = 0.0;
                  break;
               }

               assert(x < R(infinity));
               assert(x > R(-infinity));
               // assert(x == 0.0);

               if(x != 0.0)
                  theFrhs->multAdd(x, vector(i));
            }
         }
      }
   }
}